

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVProcessChain.cxx
# Opt level: O0

cmUVProcessChainBuilder * __thiscall
cmUVProcessChainBuilder::SetNoStream(cmUVProcessChainBuilder *this,Stream stdio)

{
  reference pvVar1;
  value_type *streamData;
  Stream stdio_local;
  cmUVProcessChainBuilder *this_local;
  
  if (stdio < (Stream_ERROR|Stream_OUTPUT)) {
    pvVar1 = std::array<cmUVProcessChainBuilder::StdioConfiguration,_3UL>::operator[]
                       (&this->Stdio,(ulong)stdio);
    pvVar1->Type = None;
  }
  return this;
}

Assistant:

cmUVProcessChainBuilder& cmUVProcessChainBuilder::SetNoStream(Stream stdio)
{
  switch (stdio) {
    case Stream_INPUT:
    case Stream_OUTPUT:
    case Stream_ERROR: {
      auto& streamData = this->Stdio[stdio];
      streamData.Type = None;
      break;
    }
  }
  return *this;
}